

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

bool re2::IsAnchorEnd(Regexp **pre,int depth)

{
  uint8 uVar1;
  ushort uVar2;
  bool bVar3;
  int cap;
  Regexp *in_RAX;
  ulong uVar4;
  Regexp **sub_00;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  Regexp *pRVar6;
  Regexp *this;
  int i;
  long lVar7;
  Regexp *sub;
  Regexp *local_38;
  
  this = *pre;
  if (3 < depth || this == (Regexp *)0x0) {
    return false;
  }
  uVar1 = this->op_;
  if (uVar1 == '\x13') {
    local_38 = in_RAX;
    pRVar6 = Regexp::LiteralString((Rune *)0x0,0,(uint)this->parse_flags_);
LAB_001296b8:
    *pre = pRVar6;
  }
  else {
    if (uVar1 == '\v') {
      if (this->nsub_ < 2) {
        paVar5 = &this->field_5;
      }
      else {
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_38 = Regexp::Incref(paVar5->subone_);
      bVar3 = IsAnchorEnd(&local_38,depth + 1);
      pRVar6 = local_38;
      if (!bVar3) {
        bVar3 = false;
        this = local_38;
        goto LAB_001296e6;
      }
      uVar2 = this->parse_flags_;
      cap = Regexp::cap(this);
      pRVar6 = Regexp::Capture(pRVar6,(uint)uVar2,cap);
      goto LAB_001296b8;
    }
    if (uVar1 != '\x05') {
      return false;
    }
    uVar4 = (ulong)this->nsub_;
    if (uVar4 == 0) {
      return false;
    }
    paVar5 = &this->field_5;
    if (uVar4 != 1) {
      paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    local_38 = Regexp::Incref(paVar5[uVar4 - 1].subone_);
    bVar3 = IsAnchorEnd(&local_38,depth + 1);
    if (!bVar3) {
      bVar3 = false;
      this = local_38;
      goto LAB_001296e6;
    }
    uVar2 = this->nsub_;
    sub_00 = (Regexp **)operator_new__((ulong)uVar2 * 8);
    sub_00[(ulong)uVar2 - 1] = local_38;
    for (lVar7 = 0; lVar7 < (long)((ulong)uVar2 - 1); lVar7 = lVar7 + 1) {
      paVar5 = &this->field_5;
      if (1 < uVar2) {
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      pRVar6 = Regexp::Incref(paVar5[lVar7].subone_);
      sub_00[lVar7] = pRVar6;
      uVar2 = this->nsub_;
    }
    pRVar6 = Regexp::Concat(sub_00,(uint)uVar2,(uint)this->parse_flags_);
    *pre = pRVar6;
    operator_delete__(sub_00);
  }
  bVar3 = true;
LAB_001296e6:
  Regexp::Decref(this);
  return bVar3;
}

Assistant:

static bool IsAnchorEnd(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorEnd is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[re->nsub() - 1]->Incref();
        if (IsAnchorEnd(&sub, depth+1)) {
          Regexp** subcopy = new Regexp*[re->nsub()];
          subcopy[re->nsub() - 1] = sub;  // already have reference
          for (int i = 0; i < re->nsub() - 1; i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy, re->nsub(), re->parse_flags());
          delete[] subcopy;
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorEnd(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpEndText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}